

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  uint uVar7;
  uint _w;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int *piVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  void *pvVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  void *pvVar34;
  uint uVar35;
  long lVar36;
  void *pvVar37;
  uint uVar38;
  int iVar39;
  void *pvVar40;
  void *pvVar41;
  uint uVar42;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  long lVar46;
  void *pvVar47;
  void *pvVar48;
  ulong uVar49;
  void *pvVar50;
  int iVar51;
  uint uVar52;
  void *pvVar53;
  int iVar54;
  void *pvVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  void *pvVar59;
  Allocator *pAVar60;
  int iVar61;
  ulong uVar62;
  ulong uVar63;
  void *pvVar64;
  _func_int ***ppp_Var65;
  void *pvVar66;
  void *pvVar67;
  void *pvVar68;
  long lVar69;
  void *pvVar70;
  long lVar71;
  long lVar72;
  void *pvVar73;
  void *pvVar74;
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar82 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [16];
  float fVar120;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [64];
  float fVar130;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 in_ZMM5 [64];
  undefined1 auVar134 [64];
  undefined1 auVar141 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 in_ZMM9 [64];
  float fVar146;
  undefined1 auVar145 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar147 [16];
  float *gates_data_O;
  float *gates_data_F;
  float *gates_data_I;
  float *gates_data_G;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  void *local_2f8;
  void *local_2f0;
  void *local_2e8;
  void *local_2e0;
  void *local_2c8;
  void *local_290;
  void *local_288;
  void *local_280;
  void *local_1d8;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  Mat local_78;
  undefined1 auVar107 [32];
  undefined1 auVar113 [32];
  undefined1 auVar116 [32];
  undefined1 auVar124 [32];
  
  uVar42 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  _w = top_blob->w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,(Allocator *)opt);
  iVar39 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar7) {
      uVar62 = (ulong)(int)_w;
      uVar49 = uVar62 & 0xfffffffffffffffe;
      iVar51 = (int)uVar42 >> 3;
      uVar42 = uVar42 & 7;
      iVar54 = (int)_w >> 3;
      uVar38 = _w & 7;
      lVar26 = (long)(int)(_w * 2);
      lVar36 = (long)(int)(_w * 3);
      uVar52 = iVar54 + 1;
      iVar39 = uVar38 + 1;
      uVar25 = 0;
      do {
        uVar35 = ~uVar25 + uVar7;
        if (reverse == 0) {
          uVar35 = uVar25;
        }
        local_2f8 = hidden_state->data;
        lVar27 = (long)local_78.w;
        if (0 < (int)_w >> 1) {
          pvVar47 = (void *)((long)(int)uVar35 * (long)bottom_blob->w * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar41 = bias_c->data;
          lVar28 = (long)bias_c->w * bias_c->elemsize;
          lVar29 = local_78.elemsize * lVar27;
          lVar56 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar74 = weight_xc->data;
          lVar69 = (long)weight_hc->w * weight_hc->elemsize;
          local_280 = (void *)(lVar56 * uVar62 + (long)pvVar74);
          pvVar66 = (void *)(lVar56 * lVar26 + (long)pvVar74);
          pvVar50 = (void *)(lVar56 * lVar36 + (long)pvVar74);
          pvVar53 = (void *)(lVar56 * (uVar62 + 1) + (long)pvVar74);
          pvVar55 = (void *)(lVar56 * (lVar26 + 1) + (long)pvVar74);
          pvVar43 = (void *)(lVar56 * (lVar36 + 1) + (long)pvVar74);
          pvVar33 = weight_hc->data;
          local_288 = (void *)(lVar69 * uVar62 + (long)pvVar33);
          local_2c8 = (void *)(lVar69 * lVar26 + (long)pvVar33);
          local_290 = (void *)(lVar69 * lVar36 + (long)pvVar33);
          local_128 = (void *)(lVar69 * (uVar62 + 1) + (long)pvVar33);
          pvVar30 = (void *)(lVar69 * (lVar26 + 1) + (long)pvVar33);
          pvVar68 = (void *)(lVar69 * (lVar36 + 1) + (long)pvVar33);
          lVar46 = lVar56 * 2;
          pvVar45 = (void *)((long)pvVar74 + lVar56);
          lVar32 = lVar69 * 2;
          pvVar70 = (void *)(lVar69 + (long)pvVar33);
          uVar63 = 0;
          local_138 = pvVar74;
          local_130 = pvVar33;
          do {
            lVar72 = uVar62 + uVar63 * 2;
            lVar1 = lVar26 + uVar63 * 2;
            lVar2 = lVar36 + uVar63 * 2;
            lVar5 = uVar63 * 2 + 1;
            lVar57 = uVar62 + uVar63 * 2 + 1;
            lVar31 = lVar26 + uVar63 * 2 + 1;
            lVar71 = lVar36 + uVar63 * 2 + 1;
            if (iVar51 < 1) {
              local_140 = (void *)(lVar56 * uVar63 * 2 + (long)pvVar74);
              local_148 = (void *)(lVar56 * lVar72 + (long)pvVar74);
              local_150 = (void *)(lVar56 * lVar1 + (long)pvVar74);
              local_158 = (void *)(lVar56 * lVar2 + (long)pvVar74);
              local_160 = (void *)(lVar56 * lVar5 + (long)pvVar74);
              pvVar34 = (void *)(lVar56 * lVar57 + (long)pvVar74);
              pvVar40 = (void *)(lVar56 * lVar31 + (long)pvVar74);
              pvVar59 = (void *)(lVar56 * lVar71 + (long)pvVar74);
              auVar82 = ZEXT864(0);
              auVar97 = ZEXT864(0);
              auVar119 = ZEXT864(0);
              auVar125 = ZEXT864(0);
              auVar134 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar144 = ZEXT864(0);
              auVar108 = ZEXT864(0);
              pvVar37 = pvVar47;
            }
            else {
              auVar108 = ZEXT864(0);
              lVar58 = 0;
              auVar144 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar134 = ZEXT864(0);
              auVar125 = ZEXT864(0);
              auVar119 = ZEXT864(0);
              auVar97 = ZEXT864(0);
              auVar82 = ZEXT864(0);
              uVar24 = iVar51 + 1U;
              do {
                pfVar6 = (float *)((long)pvVar47 + lVar58);
                fVar120 = *pfVar6;
                fVar130 = pfVar6[1];
                fVar126 = pfVar6[2];
                fVar135 = pfVar6[3];
                fVar127 = pfVar6[4];
                fVar136 = pfVar6[5];
                fVar128 = pfVar6[6];
                pfVar3 = (float *)((long)local_138 + lVar58);
                fVar129 = in_ZMM9._28_4_;
                auVar82 = ZEXT3264(CONCAT428(fVar129 + auVar82._28_4_,
                                             CONCAT424(fVar128 * pfVar3[6] + auVar82._24_4_,
                                                       CONCAT420(fVar136 * pfVar3[5] +
                                                                 auVar82._20_4_,
                                                                 CONCAT416(fVar127 * pfVar3[4] +
                                                                           auVar82._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar3[3] + auVar82._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + auVar82._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    auVar82._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    auVar82._0_4_))))))));
                pfVar3 = (float *)((long)local_280 + lVar58);
                pfVar4 = (float *)((long)pvVar66 + lVar58);
                auVar97 = ZEXT3264(CONCAT428(fVar129 + auVar97._28_4_,
                                             CONCAT424(fVar128 * pfVar3[6] + auVar97._24_4_,
                                                       CONCAT420(fVar136 * pfVar3[5] +
                                                                 auVar97._20_4_,
                                                                 CONCAT416(fVar127 * pfVar3[4] +
                                                                           auVar97._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar3[3] + auVar97._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + auVar97._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    auVar97._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    auVar97._0_4_))))))));
                fVar146 = in_ZMM10._28_4_;
                auVar119 = ZEXT3264(CONCAT428(fVar146 + auVar119._28_4_,
                                              CONCAT424(fVar128 * pfVar4[6] + auVar119._24_4_,
                                                        CONCAT420(fVar136 * pfVar4[5] +
                                                                  auVar119._20_4_,
                                                                  CONCAT416(fVar127 * pfVar4[4] +
                                                                            auVar119._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar4[3] + auVar119._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + auVar119._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    auVar119._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    auVar119._0_4_))))))));
                pfVar3 = (float *)((long)pvVar50 + lVar58);
                auVar125 = ZEXT3264(CONCAT428(fVar129 + auVar125._28_4_,
                                              CONCAT424(fVar128 * pfVar3[6] + auVar125._24_4_,
                                                        CONCAT420(fVar136 * pfVar3[5] +
                                                                  auVar125._20_4_,
                                                                  CONCAT416(fVar127 * pfVar3[4] +
                                                                            auVar125._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar3[3] + auVar125._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + auVar125._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    auVar125._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    auVar125._0_4_))))))));
                pfVar3 = (float *)((long)pvVar45 + lVar58);
                auVar134 = ZEXT3264(CONCAT428(fVar129 + auVar134._28_4_,
                                              CONCAT424(fVar128 * pfVar3[6] + auVar134._24_4_,
                                                        CONCAT420(fVar136 * pfVar3[5] +
                                                                  auVar134._20_4_,
                                                                  CONCAT416(fVar127 * pfVar3[4] +
                                                                            auVar134._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar3[3] + auVar134._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + auVar134._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    auVar134._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    auVar134._0_4_))))))));
                pfVar3 = (float *)((long)pvVar53 + lVar58);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar129,CONCAT424(fVar128 * pfVar3[6],
                                                               CONCAT420(fVar136 * pfVar3[5],
                                                                         CONCAT416(fVar127 * pfVar3[
                                                  4],CONCAT412(fVar135 * pfVar3[3],
                                                               CONCAT48(fVar126 * pfVar3[2],
                                                                        CONCAT44(fVar130 * pfVar3[1]
                                                                                 ,fVar120 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar55 + lVar58);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar146,CONCAT424(fVar128 * pfVar4[6],
                                                                CONCAT420(fVar136 * pfVar4[5],
                                                                          CONCAT416(fVar127 * pfVar4
                                                  [4],CONCAT412(fVar135 * pfVar4[3],
                                                                CONCAT48(fVar126 * pfVar4[2],
                                                                         CONCAT44(fVar130 * pfVar4[1
                                                  ],fVar120 * *pfVar4))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar129 + in_ZMM6._28_4_,
                                             CONCAT424(fVar128 * pfVar3[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar136 * pfVar3[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar127 * pfVar3[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar3[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    in_ZMM6._0_4_))))))));
                auVar144 = ZEXT3264(CONCAT428(fVar146 + auVar144._28_4_,
                                              CONCAT424(fVar128 * pfVar4[6] + auVar144._24_4_,
                                                        CONCAT420(fVar136 * pfVar4[5] +
                                                                  auVar144._20_4_,
                                                                  CONCAT416(fVar127 * pfVar4[4] +
                                                                            auVar144._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar4[3] + auVar144._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + auVar144._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    auVar144._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    auVar144._0_4_))))))));
                pfVar3 = (float *)((long)pvVar43 + lVar58);
                auVar108 = ZEXT3264(CONCAT428(pfVar6[7] + auVar108._28_4_,
                                              CONCAT424(fVar128 * pfVar3[6] + auVar108._24_4_,
                                                        CONCAT420(fVar136 * pfVar3[5] +
                                                                  auVar108._20_4_,
                                                                  CONCAT416(fVar127 * pfVar3[4] +
                                                                            auVar108._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar3[3] + auVar108._12_4_,
                                                  CONCAT48(fVar126 * pfVar3[2] + auVar108._8_4_,
                                                           CONCAT44(fVar130 * pfVar3[1] +
                                                                    auVar108._4_4_,
                                                                    fVar120 * *pfVar3 +
                                                                    auVar108._0_4_))))))));
                lVar58 = lVar58 + 0x20;
                uVar24 = uVar24 - 1;
              } while (1 < uVar24);
              local_140 = (void *)((long)local_138 + lVar58);
              local_148 = (void *)((long)local_280 + lVar58);
              local_150 = (void *)((long)pvVar66 + lVar58);
              local_158 = (void *)((long)pvVar50 + lVar58);
              local_160 = (void *)((long)pvVar45 + lVar58);
              pvVar34 = (void *)((long)pvVar53 + lVar58);
              pvVar40 = (void *)((long)pvVar55 + lVar58);
              pvVar59 = (void *)(lVar58 + (long)pvVar43);
              pvVar37 = (void *)((long)pvVar47 + lVar58);
            }
            auVar122 = auVar125._0_32_;
            auVar143 = auVar144._0_32_;
            auVar90 = auVar97._0_32_;
            auVar76 = auVar82._0_32_;
            auVar111 = auVar119._0_32_;
            auVar131 = auVar134._0_32_;
            auVar100 = auVar108._0_32_;
            if (iVar54 < 1) {
              pvVar48 = (void *)(lVar69 * uVar63 * 2 + (long)pvVar33);
              local_2e0 = (void *)(lVar72 * lVar69 + (long)pvVar33);
              local_2e8 = (void *)(lVar1 * lVar69 + (long)pvVar33);
              local_1d8 = (void *)(lVar2 * lVar69 + (long)pvVar33);
              pvVar67 = (void *)(lVar69 * lVar5 + (long)pvVar33);
              pvVar44 = (void *)(lVar57 * lVar69 + (long)pvVar33);
              local_2f0 = (void *)(lVar31 * lVar69 + (long)pvVar33);
              pvVar73 = (void *)(lVar71 * lVar69 + (long)pvVar33);
              pvVar64 = local_2f8;
            }
            else {
              lVar72 = 0;
              uVar24 = uVar52;
              do {
                pfVar3 = (float *)((long)local_2f8 + lVar72);
                fVar120 = *pfVar3;
                fVar130 = pfVar3[1];
                fVar126 = pfVar3[2];
                fVar135 = pfVar3[3];
                fVar127 = pfVar3[4];
                fVar136 = pfVar3[5];
                fVar128 = pfVar3[6];
                pfVar4 = (float *)((long)local_130 + lVar72);
                auVar76._0_4_ = fVar120 * *pfVar4 + auVar82._0_4_;
                auVar76._4_4_ = fVar130 * pfVar4[1] + auVar82._4_4_;
                auVar76._8_4_ = fVar126 * pfVar4[2] + auVar82._8_4_;
                auVar76._12_4_ = fVar135 * pfVar4[3] + auVar82._12_4_;
                auVar76._16_4_ = fVar127 * pfVar4[4] + auVar82._16_4_;
                auVar76._20_4_ = fVar136 * pfVar4[5] + auVar82._20_4_;
                auVar76._24_4_ = fVar128 * pfVar4[6] + auVar82._24_4_;
                fVar129 = in_ZMM9._28_4_;
                auVar76._28_4_ = fVar129 + auVar82._28_4_;
                auVar82 = ZEXT3264(auVar76);
                pfVar4 = (float *)((long)local_288 + lVar72);
                pfVar6 = (float *)((long)local_2c8 + lVar72);
                auVar90._0_4_ = fVar120 * *pfVar4 + auVar97._0_4_;
                auVar90._4_4_ = fVar130 * pfVar4[1] + auVar97._4_4_;
                auVar90._8_4_ = fVar126 * pfVar4[2] + auVar97._8_4_;
                auVar90._12_4_ = fVar135 * pfVar4[3] + auVar97._12_4_;
                auVar90._16_4_ = fVar127 * pfVar4[4] + auVar97._16_4_;
                auVar90._20_4_ = fVar136 * pfVar4[5] + auVar97._20_4_;
                auVar90._24_4_ = fVar128 * pfVar4[6] + auVar97._24_4_;
                auVar90._28_4_ = fVar129 + auVar97._28_4_;
                auVar97 = ZEXT3264(auVar90);
                auVar111._0_4_ = fVar120 * *pfVar6 + auVar119._0_4_;
                auVar111._4_4_ = fVar130 * pfVar6[1] + auVar119._4_4_;
                auVar111._8_4_ = fVar126 * pfVar6[2] + auVar119._8_4_;
                auVar111._12_4_ = fVar135 * pfVar6[3] + auVar119._12_4_;
                auVar111._16_4_ = fVar127 * pfVar6[4] + auVar119._16_4_;
                auVar111._20_4_ = fVar136 * pfVar6[5] + auVar119._20_4_;
                auVar111._24_4_ = fVar128 * pfVar6[6] + auVar119._24_4_;
                fVar146 = in_ZMM10._28_4_;
                auVar111._28_4_ = fVar146 + auVar119._28_4_;
                auVar119 = ZEXT3264(auVar111);
                pfVar4 = (float *)((long)local_290 + lVar72);
                auVar122._0_4_ = fVar120 * *pfVar4 + auVar125._0_4_;
                auVar122._4_4_ = fVar130 * pfVar4[1] + auVar125._4_4_;
                auVar122._8_4_ = fVar126 * pfVar4[2] + auVar125._8_4_;
                auVar122._12_4_ = fVar135 * pfVar4[3] + auVar125._12_4_;
                auVar122._16_4_ = fVar127 * pfVar4[4] + auVar125._16_4_;
                auVar122._20_4_ = fVar136 * pfVar4[5] + auVar125._20_4_;
                auVar122._24_4_ = fVar128 * pfVar4[6] + auVar125._24_4_;
                auVar122._28_4_ = fVar129 + auVar125._28_4_;
                auVar125 = ZEXT3264(auVar122);
                pfVar4 = (float *)((long)pvVar70 + lVar72);
                auVar131._0_4_ = fVar120 * *pfVar4 + auVar134._0_4_;
                auVar131._4_4_ = fVar130 * pfVar4[1] + auVar134._4_4_;
                auVar131._8_4_ = fVar126 * pfVar4[2] + auVar134._8_4_;
                auVar131._12_4_ = fVar135 * pfVar4[3] + auVar134._12_4_;
                auVar131._16_4_ = fVar127 * pfVar4[4] + auVar134._16_4_;
                auVar131._20_4_ = fVar136 * pfVar4[5] + auVar134._20_4_;
                auVar131._24_4_ = fVar128 * pfVar4[6] + auVar134._24_4_;
                auVar131._28_4_ = fVar129 + auVar134._28_4_;
                auVar134 = ZEXT3264(auVar131);
                pfVar4 = (float *)((long)local_128 + lVar72);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar129,CONCAT424(fVar128 * pfVar4[6],
                                                               CONCAT420(fVar136 * pfVar4[5],
                                                                         CONCAT416(fVar127 * pfVar4[
                                                  4],CONCAT412(fVar135 * pfVar4[3],
                                                               CONCAT48(fVar126 * pfVar4[2],
                                                                        CONCAT44(fVar130 * pfVar4[1]
                                                                                 ,fVar120 * *pfVar4)
                                                                       )))))));
                pfVar6 = (float *)((long)pvVar30 + lVar72);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar146,CONCAT424(fVar128 * pfVar6[6],
                                                                CONCAT420(fVar136 * pfVar6[5],
                                                                          CONCAT416(fVar127 * pfVar6
                                                  [4],CONCAT412(fVar135 * pfVar6[3],
                                                                CONCAT48(fVar126 * pfVar6[2],
                                                                         CONCAT44(fVar130 * pfVar6[1
                                                  ],fVar120 * *pfVar6))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar129 + in_ZMM6._28_4_,
                                             CONCAT424(fVar128 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar136 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar127 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar143._0_4_ = fVar120 * *pfVar6 + auVar144._0_4_;
                auVar143._4_4_ = fVar130 * pfVar6[1] + auVar144._4_4_;
                auVar143._8_4_ = fVar126 * pfVar6[2] + auVar144._8_4_;
                auVar143._12_4_ = fVar135 * pfVar6[3] + auVar144._12_4_;
                auVar143._16_4_ = fVar127 * pfVar6[4] + auVar144._16_4_;
                auVar143._20_4_ = fVar136 * pfVar6[5] + auVar144._20_4_;
                auVar143._24_4_ = fVar128 * pfVar6[6] + auVar144._24_4_;
                auVar143._28_4_ = fVar146 + auVar144._28_4_;
                auVar144 = ZEXT3264(auVar143);
                pfVar4 = (float *)((long)pvVar68 + lVar72);
                auVar100._0_4_ = fVar120 * *pfVar4 + auVar108._0_4_;
                auVar100._4_4_ = fVar130 * pfVar4[1] + auVar108._4_4_;
                auVar100._8_4_ = fVar126 * pfVar4[2] + auVar108._8_4_;
                auVar100._12_4_ = fVar135 * pfVar4[3] + auVar108._12_4_;
                auVar100._16_4_ = fVar127 * pfVar4[4] + auVar108._16_4_;
                auVar100._20_4_ = fVar136 * pfVar4[5] + auVar108._20_4_;
                auVar100._24_4_ = fVar128 * pfVar4[6] + auVar108._24_4_;
                auVar100._28_4_ = pfVar3[7] + auVar108._28_4_;
                auVar108 = ZEXT3264(auVar100);
                lVar72 = lVar72 + 0x20;
                uVar24 = uVar24 - 1;
              } while (1 < uVar24);
              pvVar48 = (void *)((long)local_130 + lVar72);
              local_2e0 = (void *)((long)local_288 + lVar72);
              local_2e8 = (void *)((long)local_2c8 + lVar72);
              local_1d8 = (void *)((long)local_290 + lVar72);
              pvVar67 = (void *)((long)pvVar70 + lVar72);
              pvVar44 = (void *)((long)local_128 + lVar72);
              local_2f0 = (void *)((long)pvVar30 + lVar72);
              pvVar73 = (void *)(lVar72 + (long)pvVar68);
              pvVar64 = (void *)((long)local_2f8 + lVar72);
            }
            auVar100 = vhaddps_avx(auVar143,auVar100);
            auVar131 = vhaddps_avx(auVar131,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar131);
            auVar100 = vhaddps_avx(auVar131,auVar100);
            auVar111 = vhaddps_avx(auVar111,auVar122);
            auVar76 = vhaddps_avx(auVar76,auVar90);
            auVar90 = vhaddps_avx(auVar76,auVar111);
            auVar76 = vblendps_avx(auVar90,auVar100,0xf0);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar41 + lVar5 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar41 + lVar5 * 4 + lVar28)),0x10);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar41 + lVar5 * 4 + lVar28 * 2
                                                             )),0x20);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar41 + lVar5 * 4 + lVar28 * 3
                                                             )),0x30);
            in_ZMM3 = ZEXT1664(auVar89);
            auVar90 = vperm2f128_avx(auVar90,auVar100,0x21);
            auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar41 + uVar63 * 8)),
                                     ZEXT416(*(uint *)((long)pvVar41 + uVar63 * 8 + lVar28)),0x10);
            auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)pvVar41 +
                                                               uVar63 * 8 + lVar28 * 2)),0x20);
            auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)pvVar41 +
                                                               uVar63 * 8 + lVar28 * 3)),0x30);
            auVar82 = ZEXT3264(CONCAT428(auVar76._28_4_ + auVar90._28_4_ + auVar89._12_4_,
                                         CONCAT424(auVar76._24_4_ + auVar90._24_4_ + auVar89._8_4_,
                                                   CONCAT420(auVar76._20_4_ + auVar90._20_4_ +
                                                             auVar89._4_4_,
                                                             CONCAT416(auVar76._16_4_ +
                                                                       auVar90._16_4_ +
                                                                       auVar89._0_4_,
                                                                       CONCAT412(auVar76._12_4_ +
                                                                                 auVar90._12_4_ +
                                                                                 auVar147._12_4_,
                                                                                 CONCAT48(auVar76.
                                                  _8_4_ + auVar90._8_4_ + auVar147._8_4_,
                                                  CONCAT44(auVar76._4_4_ + auVar90._4_4_ +
                                                           auVar147._4_4_,
                                                           auVar76._0_4_ + auVar90._0_4_ +
                                                           auVar147._0_4_))))))));
            if (uVar42 != 0) {
              lVar72 = 0;
              iVar61 = uVar42 + 1;
              do {
                auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)local_160 + lVar72)),
                                        ZEXT416(*(uint *)((long)pvVar34 + lVar72)),0x10);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar40 + lVar72)),0x20);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar59 + lVar72)),0x30);
                auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)local_140 + lVar72)),
                                         ZEXT416(*(uint *)((long)local_148 + lVar72)),0x10);
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_150 + lVar72)),0x20)
                ;
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_158 + lVar72)),0x30)
                ;
                fVar120 = *(float *)((long)pvVar37 + lVar72);
                auVar82 = ZEXT3264(CONCAT428(auVar89._12_4_ + auVar82._28_4_,
                                             CONCAT424(auVar89._8_4_ * fVar120 + auVar82._24_4_,
                                                       CONCAT420(auVar89._4_4_ * fVar120 +
                                                                 auVar82._20_4_,
                                                                 CONCAT416(auVar89._0_4_ * fVar120 +
                                                                           auVar82._16_4_,
                                                                           CONCAT412(auVar147._12_4_
                                                                                     * fVar120 +
                                                                                     auVar82._12_4_,
                                                                                     CONCAT48(
                                                  auVar147._8_4_ * fVar120 + auVar82._8_4_,
                                                  CONCAT44(auVar147._4_4_ * fVar120 + auVar82._4_4_,
                                                           auVar147._0_4_ * fVar120 + auVar82._0_4_)
                                                  )))))));
                lVar72 = lVar72 + 4;
                iVar61 = iVar61 + -1;
              } while (1 < iVar61);
            }
            auVar77 = auVar82._0_32_;
            if (uVar38 != 0) {
              lVar72 = 0;
              iVar61 = iVar39;
              do {
                auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar72)),
                                        ZEXT416(*(uint *)((long)pvVar44 + lVar72)),0x10);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)local_2f0 + lVar72)),0x20);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar73 + lVar72)),0x30);
                auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar48 + lVar72)),
                                         ZEXT416(*(uint *)((long)local_2e0 + lVar72)),0x10);
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_2e8 + lVar72)),0x20)
                ;
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_1d8 + lVar72)),0x30)
                ;
                fVar120 = *(float *)((long)pvVar64 + lVar72);
                auVar77._0_4_ = auVar147._0_4_ * fVar120 + auVar82._0_4_;
                auVar77._4_4_ = auVar147._4_4_ * fVar120 + auVar82._4_4_;
                auVar77._8_4_ = auVar147._8_4_ * fVar120 + auVar82._8_4_;
                auVar77._12_4_ = auVar147._12_4_ * fVar120 + auVar82._12_4_;
                auVar77._16_4_ = auVar89._0_4_ * fVar120 + auVar82._16_4_;
                auVar77._20_4_ = auVar89._4_4_ * fVar120 + auVar82._20_4_;
                auVar77._24_4_ = auVar89._8_4_ * fVar120 + auVar82._24_4_;
                auVar77._28_4_ = auVar89._12_4_ + auVar82._28_4_;
                auVar82 = ZEXT3264(auVar77);
                lVar72 = lVar72 + 4;
                iVar61 = iVar61 + -1;
              } while (1 < iVar61);
            }
            *(int *)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator =
                 auVar77._0_4_;
            auVar89 = auVar77._0_16_;
            uVar8 = vextractps_avx(auVar89,1);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator + lVar29) =
                 uVar8;
            uVar8 = vextractps_avx(auVar89,2);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator + lVar29 * 2
             ) = uVar8;
            uVar8 = vextractps_avx(auVar89,3);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator + lVar29 * 3
             ) = uVar8;
            auVar89 = auVar77._16_16_;
            *(int *)((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator + 4)
                 = auVar77._16_4_;
            uVar8 = vextractps_avx(auVar89,1);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator + lVar29 + 4
             ) = uVar8;
            uVar8 = vextractps_avx(auVar89,2);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator +
             lVar29 * 2 + 4) = uVar8;
            uVar8 = vextractps_avx(auVar89,3);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar63 * 8))->_vptr_Allocator +
             lVar29 * 3 + 4) = uVar8;
            uVar63 = uVar63 + 1;
            local_138 = (void *)((long)local_138 + lVar46);
            local_280 = (void *)((long)local_280 + lVar46);
            pvVar66 = (void *)((long)pvVar66 + lVar46);
            pvVar50 = (void *)((long)pvVar50 + lVar46);
            pvVar45 = (void *)((long)pvVar45 + lVar46);
            pvVar53 = (void *)((long)pvVar53 + lVar46);
            pvVar55 = (void *)((long)pvVar55 + lVar46);
            pvVar43 = (void *)((long)pvVar43 + lVar46);
            local_130 = (void *)((long)local_130 + lVar32);
            local_288 = (void *)((long)local_288 + lVar32);
            local_2c8 = (void *)((long)local_2c8 + lVar32);
            local_290 = (void *)((long)local_290 + lVar32);
            pvVar70 = (void *)((long)pvVar70 + lVar32);
            local_128 = (void *)((long)local_128 + lVar32);
            pvVar30 = (void *)((long)pvVar30 + lVar32);
            pvVar68 = (void *)((long)pvVar68 + lVar32);
          } while (uVar63 != (uint)((int)_w >> 1));
        }
        auVar142._8_4_ = 0x3f800000;
        auVar142._0_8_ = 0x3f8000003f800000;
        auVar142._12_4_ = 0x3f800000;
        auVar142._16_4_ = 0x3f800000;
        auVar142._20_4_ = 0x3f800000;
        auVar142._24_4_ = 0x3f800000;
        auVar142._28_4_ = 0x3f800000;
        if ((uint)uVar49 == _w) {
          lVar46 = local_78.elemsize * lVar27 * 3;
        }
        else {
          pvVar43 = (void *)((long)bottom_blob->w * (long)(int)uVar35 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          lVar32 = (long)bias_c->w * bias_c->elemsize;
          pvVar45 = bias_c->data;
          lVar29 = local_78.elemsize * lVar27;
          pvVar41 = weight_xc->data;
          lVar28 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar74 = weight_hc->data;
          lVar56 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar66 = (void *)(lVar28 * (lVar36 + uVar49) + (long)pvVar41);
          pvVar50 = (void *)(lVar28 * (lVar26 + uVar49) + (long)pvVar41);
          pvVar30 = (void *)(lVar28 * (uVar62 + uVar49) + (long)pvVar41);
          pvVar33 = (void *)(lVar28 * uVar49 + (long)pvVar41);
          local_2e8 = (void *)(lVar56 * (lVar36 + uVar49) + (long)pvVar74);
          pvVar47 = (void *)(lVar56 * (lVar26 + uVar49) + (long)pvVar74);
          pvVar53 = (void *)(lVar56 * (uVar62 + uVar49) + (long)pvVar74);
          pvVar55 = (void *)(lVar56 * uVar49 + (long)pvVar74);
          lVar46 = lVar29 * 3;
          uVar63 = uVar49;
          do {
            if (iVar51 < 1) {
              pvVar40 = (void *)(lVar28 * uVar63 + (long)pvVar41);
              pvVar34 = (void *)(lVar28 * (uVar63 + uVar62) + (long)pvVar41);
              pvVar70 = (void *)(lVar28 * (uVar63 + lVar26) + (long)pvVar41);
              pvVar68 = (void *)(lVar28 * (uVar63 + lVar36) + (long)pvVar41);
              auVar97 = ZEXT864(0);
              auVar108 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar82 = ZEXT864(0);
              pvVar37 = pvVar43;
            }
            else {
              auVar82 = ZEXT864(0);
              lVar69 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar108 = ZEXT864(0);
              auVar97 = ZEXT864(0);
              auVar119 = in_ZMM6;
              uVar24 = iVar51 + 1U;
              do {
                pfVar3 = (float *)((long)pvVar43 + lVar69);
                fVar120 = *pfVar3;
                fVar130 = pfVar3[1];
                fVar126 = pfVar3[2];
                fVar135 = pfVar3[3];
                fVar127 = pfVar3[4];
                fVar136 = pfVar3[5];
                fVar128 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar33 + lVar69);
                fVar129 = in_ZMM5._28_4_;
                auVar97 = ZEXT3264(CONCAT428(fVar129 + auVar97._28_4_,
                                             CONCAT424(fVar128 * pfVar4[6] + auVar97._24_4_,
                                                       CONCAT420(fVar136 * pfVar4[5] +
                                                                 auVar97._20_4_,
                                                                 CONCAT416(fVar127 * pfVar4[4] +
                                                                           auVar97._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar4[3] + auVar97._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + auVar97._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    auVar97._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    auVar97._0_4_))))))));
                pfVar4 = (float *)((long)pvVar30 + lVar69);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar129,CONCAT424(fVar128 * pfVar4[6],
                                                               CONCAT420(fVar136 * pfVar4[5],
                                                                         CONCAT416(fVar127 * pfVar4[
                                                  4],CONCAT412(fVar135 * pfVar4[3],
                                                               CONCAT48(fVar126 * pfVar4[2],
                                                                        CONCAT44(fVar130 * pfVar4[1]
                                                                                 ,fVar120 * *pfVar4)
                                                                       )))))));
                pfVar6 = (float *)((long)pvVar50 + lVar69);
                auVar125._0_4_ = fVar120 * *pfVar6;
                auVar125._4_4_ = fVar130 * pfVar6[1];
                auVar125._8_4_ = fVar126 * pfVar6[2];
                auVar125._12_4_ = fVar135 * pfVar6[3];
                auVar125._16_4_ = fVar127 * pfVar6[4];
                auVar125._20_4_ = fVar136 * pfVar6[5];
                auVar125._28_36_ = auVar119._28_36_;
                auVar125._24_4_ = fVar128 * pfVar6[6];
                in_ZMM6 = ZEXT3264(auVar125._0_32_);
                auVar108 = ZEXT3264(CONCAT428(fVar129 + auVar108._28_4_,
                                              CONCAT424(fVar128 * pfVar4[6] + auVar108._24_4_,
                                                        CONCAT420(fVar136 * pfVar4[5] +
                                                                  auVar108._20_4_,
                                                                  CONCAT416(fVar127 * pfVar4[4] +
                                                                            auVar108._16_4_,
                                                                            CONCAT412(fVar135 * 
                                                  pfVar4[3] + auVar108._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + auVar108._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    auVar108._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    auVar108._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar119._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar125._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar125._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar125._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar125._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar125._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar125._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar125._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar66 + lVar69);
                auVar82 = ZEXT3264(CONCAT428(pfVar3[7] + auVar82._28_4_,
                                             CONCAT424(fVar128 * pfVar4[6] + auVar82._24_4_,
                                                       CONCAT420(fVar136 * pfVar4[5] +
                                                                 auVar82._20_4_,
                                                                 CONCAT416(fVar127 * pfVar4[4] +
                                                                           auVar82._16_4_,
                                                                           CONCAT412(fVar135 * 
                                                  pfVar4[3] + auVar82._12_4_,
                                                  CONCAT48(fVar126 * pfVar4[2] + auVar82._8_4_,
                                                           CONCAT44(fVar130 * pfVar4[1] +
                                                                    auVar82._4_4_,
                                                                    fVar120 * *pfVar4 +
                                                                    auVar82._0_4_))))))));
                uVar24 = uVar24 - 1;
                lVar69 = lVar69 + 0x20;
                auVar119 = in_ZMM6;
              } while (1 < uVar24);
              pvVar68 = (void *)((long)pvVar66 + lVar69);
              pvVar70 = (void *)((long)pvVar50 + lVar69);
              pvVar34 = (void *)((long)pvVar30 + lVar69);
              pvVar40 = (void *)((long)pvVar33 + lVar69);
              pvVar37 = (void *)(lVar69 + (long)pvVar43);
            }
            auVar101 = auVar108._0_32_;
            auVar91 = auVar97._0_32_;
            auVar78 = auVar82._0_32_;
            if (iVar54 < 1) {
              pvVar67 = (void *)(lVar56 * uVar63 + (long)pvVar74);
              pvVar48 = (void *)((uVar63 + uVar62) * lVar56 + (long)pvVar74);
              pvVar59 = (void *)((uVar63 + lVar26) * lVar56 + (long)pvVar74);
              pvVar64 = (void *)((uVar63 + lVar36) * lVar56 + (long)pvVar74);
              pvVar44 = local_2f8;
            }
            else {
              lVar69 = 0;
              auVar119 = in_ZMM6;
              uVar24 = uVar52;
              do {
                pfVar3 = (float *)((long)local_2f8 + lVar69);
                fVar120 = *pfVar3;
                fVar130 = pfVar3[1];
                fVar126 = pfVar3[2];
                fVar135 = pfVar3[3];
                fVar127 = pfVar3[4];
                fVar136 = pfVar3[5];
                fVar128 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar55 + lVar69);
                auVar91._0_4_ = fVar120 * *pfVar4 + auVar97._0_4_;
                auVar91._4_4_ = fVar130 * pfVar4[1] + auVar97._4_4_;
                auVar91._8_4_ = fVar126 * pfVar4[2] + auVar97._8_4_;
                auVar91._12_4_ = fVar135 * pfVar4[3] + auVar97._12_4_;
                auVar91._16_4_ = fVar127 * pfVar4[4] + auVar97._16_4_;
                auVar91._20_4_ = fVar136 * pfVar4[5] + auVar97._20_4_;
                auVar91._24_4_ = fVar128 * pfVar4[6] + auVar97._24_4_;
                fVar129 = in_ZMM5._28_4_;
                auVar91._28_4_ = fVar129 + auVar97._28_4_;
                auVar97 = ZEXT3264(auVar91);
                pfVar4 = (float *)((long)pvVar53 + lVar69);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar129,CONCAT424(fVar128 * pfVar4[6],
                                                               CONCAT420(fVar136 * pfVar4[5],
                                                                         CONCAT416(fVar127 * pfVar4[
                                                  4],CONCAT412(fVar135 * pfVar4[3],
                                                               CONCAT48(fVar126 * pfVar4[2],
                                                                        CONCAT44(fVar130 * pfVar4[1]
                                                                                 ,fVar120 * *pfVar4)
                                                                       )))))));
                pfVar6 = (float *)((long)pvVar47 + lVar69);
                auVar134._0_4_ = fVar120 * *pfVar6;
                auVar134._4_4_ = fVar130 * pfVar6[1];
                auVar134._8_4_ = fVar126 * pfVar6[2];
                auVar134._12_4_ = fVar135 * pfVar6[3];
                auVar134._16_4_ = fVar127 * pfVar6[4];
                auVar134._20_4_ = fVar136 * pfVar6[5];
                auVar134._28_36_ = auVar119._28_36_;
                auVar134._24_4_ = fVar128 * pfVar6[6];
                in_ZMM6 = ZEXT3264(auVar134._0_32_);
                auVar101._0_4_ = fVar120 * *pfVar4 + auVar108._0_4_;
                auVar101._4_4_ = fVar130 * pfVar4[1] + auVar108._4_4_;
                auVar101._8_4_ = fVar126 * pfVar4[2] + auVar108._8_4_;
                auVar101._12_4_ = fVar135 * pfVar4[3] + auVar108._12_4_;
                auVar101._16_4_ = fVar127 * pfVar4[4] + auVar108._16_4_;
                auVar101._20_4_ = fVar136 * pfVar4[5] + auVar108._20_4_;
                auVar101._24_4_ = fVar128 * pfVar4[6] + auVar108._24_4_;
                auVar101._28_4_ = fVar129 + auVar108._28_4_;
                auVar108 = ZEXT3264(auVar101);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar119._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar134._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar134._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar134._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar134._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar134._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar134._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar134._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)local_2e8 + lVar69);
                auVar78._0_4_ = fVar120 * *pfVar4 + auVar82._0_4_;
                auVar78._4_4_ = fVar130 * pfVar4[1] + auVar82._4_4_;
                auVar78._8_4_ = fVar126 * pfVar4[2] + auVar82._8_4_;
                auVar78._12_4_ = fVar135 * pfVar4[3] + auVar82._12_4_;
                auVar78._16_4_ = fVar127 * pfVar4[4] + auVar82._16_4_;
                auVar78._20_4_ = fVar136 * pfVar4[5] + auVar82._20_4_;
                auVar78._24_4_ = fVar128 * pfVar4[6] + auVar82._24_4_;
                auVar78._28_4_ = pfVar3[7] + auVar82._28_4_;
                auVar82 = ZEXT3264(auVar78);
                uVar24 = uVar24 - 1;
                lVar69 = lVar69 + 0x20;
                auVar119 = in_ZMM6;
              } while (1 < uVar24);
              pvVar64 = (void *)((long)local_2e8 + lVar69);
              pvVar59 = (void *)((long)pvVar47 + lVar69);
              pvVar48 = (void *)((long)pvVar53 + lVar69);
              pvVar67 = (void *)((long)pvVar55 + lVar69);
              pvVar44 = (void *)(lVar69 + (long)local_2f8);
            }
            auVar76 = vhaddps_avx(in_ZMM3._0_32_,auVar78);
            auVar90 = vhaddps_avx(auVar91,auVar101);
            auVar76 = vhaddps_avx(auVar90,auVar76);
            auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar45 + uVar63 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar45 + uVar63 * 4 + lVar32)),0x10);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar45 +
                                                             uVar63 * 4 + lVar32 * 2)),0x20);
            auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar45 +
                                                             uVar63 * 4 + lVar32 * 3)),0x30);
            auVar82 = ZEXT1664(CONCAT412(auVar89._12_4_ + auVar76._12_4_ + auVar76._28_4_,
                                         CONCAT48(auVar89._8_4_ + auVar76._8_4_ + auVar76._24_4_,
                                                  CONCAT44(auVar89._4_4_ + auVar76._4_4_ +
                                                           auVar76._20_4_,
                                                           auVar89._0_4_ + auVar76._0_4_ +
                                                           auVar76._16_4_))));
            if (uVar42 != 0) {
              lVar69 = 0;
              iVar61 = uVar42 + 1;
              do {
                auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar40 + lVar69)),
                                        ZEXT416(*(uint *)((long)pvVar34 + lVar69)),0x10);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar70 + lVar69)),0x20);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar68 + lVar69)),0x30);
                fVar120 = *(float *)((long)pvVar37 + lVar69);
                auVar82 = ZEXT1664(CONCAT412(auVar89._12_4_ * fVar120 + auVar82._12_4_,
                                             CONCAT48(auVar89._8_4_ * fVar120 + auVar82._8_4_,
                                                      CONCAT44(auVar89._4_4_ * fVar120 +
                                                               auVar82._4_4_,
                                                               auVar89._0_4_ * fVar120 +
                                                               auVar82._0_4_))));
                iVar61 = iVar61 + -1;
                lVar69 = lVar69 + 4;
              } while (1 < iVar61);
            }
            auVar89 = auVar82._0_16_;
            if (uVar38 != 0) {
              lVar69 = 0;
              iVar61 = iVar39;
              do {
                auVar89 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar69)),
                                        ZEXT416(*(uint *)((long)pvVar48 + lVar69)),0x10);
                auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar59 + lVar69)),0x20);
                auVar147 = vinsertps_avx(auVar89,ZEXT416(*(uint *)((long)pvVar64 + lVar69)),0x30);
                fVar120 = *(float *)((long)pvVar44 + lVar69);
                auVar89._0_4_ = auVar147._0_4_ * fVar120 + auVar82._0_4_;
                auVar89._4_4_ = auVar147._4_4_ * fVar120 + auVar82._4_4_;
                auVar89._8_4_ = auVar147._8_4_ * fVar120 + auVar82._8_4_;
                auVar89._12_4_ = auVar147._12_4_ * fVar120 + auVar82._12_4_;
                auVar82 = ZEXT1664(auVar89);
                iVar61 = iVar61 + -1;
                lVar69 = lVar69 + 4;
              } while (1 < iVar61);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar63 * 4) = auVar89._0_4_;
            uVar8 = vextractps_avx(auVar89,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar63 * 4 + lVar29) = uVar8;
            uVar8 = vextractps_avx(auVar89,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar63 * 4 + lVar29 * 2) = uVar8;
            uVar8 = vextractps_avx(auVar89,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar63 * 4 + lVar46) = uVar8;
            uVar63 = uVar63 + 1;
            pvVar66 = (void *)((long)pvVar66 + lVar28);
            pvVar50 = (void *)((long)pvVar50 + lVar28);
            pvVar30 = (void *)((long)pvVar30 + lVar28);
            pvVar33 = (void *)((long)pvVar33 + lVar28);
            local_2e8 = (void *)((long)local_2e8 + lVar56);
            pvVar47 = (void *)((long)pvVar47 + lVar56);
            pvVar53 = (void *)((long)pvVar53 + lVar56);
            pvVar55 = (void *)((long)pvVar55 + lVar56);
          } while ((long)uVar63 < (long)uVar62);
        }
        pvVar74 = (void *)((long)top_blob->w * (long)(int)uVar35 * top_blob->elemsize +
                          (long)top_blob->data);
        ppp_Var65 = (_func_int ***)((long)(_func_int ***)local_78.data + local_78.elemsize * lVar27)
        ;
        pvVar41 = (void *)((long)(_func_int ***)local_78.data + local_78.elemsize * lVar27 * 2);
        lVar46 = (long)(_func_int ***)local_78.data + lVar46;
        pvVar45 = cell_state->data;
        pAVar60 = (Allocator *)local_78.data;
        if (0 < iVar54) {
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = 0x3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          lVar27 = 0;
          uVar35 = uVar52;
          do {
            lVar32 = lVar27;
            auVar76 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar32);
            auVar79._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar79._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar79._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar79._16_4_ = auVar76._16_4_ ^ 0x80000000;
            auVar79._20_4_ = auVar76._20_4_ ^ 0x80000000;
            auVar79._24_4_ = auVar76._24_4_ ^ 0x80000000;
            auVar79._28_4_ = auVar76._28_4_ ^ 0x80000000;
            auVar145._8_4_ = 0x42b0c0a5;
            auVar145._0_8_ = 0x42b0c0a542b0c0a5;
            auVar145._12_4_ = 0x42b0c0a5;
            auVar145._16_4_ = 0x42b0c0a5;
            auVar145._20_4_ = 0x42b0c0a5;
            auVar145._24_4_ = 0x42b0c0a5;
            auVar145._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar145);
            auVar76 = vminps_avx(auVar145,auVar79);
            auVar92._8_4_ = 0xc2b0c0a5;
            auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar92._12_4_ = 0xc2b0c0a5;
            auVar92._16_4_ = 0xc2b0c0a5;
            auVar92._20_4_ = 0xc2b0c0a5;
            auVar92._24_4_ = 0xc2b0c0a5;
            auVar92._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar76,auVar92);
            in_ZMM9 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                         CONCAT424(0x3fb8aa3b,
                                                   CONCAT420(0x3fb8aa3b,
                                                             CONCAT416(0x3fb8aa3b,
                                                                       CONCAT412(0x3fb8aa3b,
                                                                                 CONCAT48(0x3fb8aa3b
                                                                                          ,
                                                  0x3fb8aa3b3fb8aa3b)))))));
            auVar93._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
            auVar93._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
            auVar93._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
            auVar93._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
            auVar93._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
            auVar93._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
            auVar93._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
            auVar93._28_4_ = 0xc2afc0a5;
            auVar100 = vroundps_avx(auVar93,1);
            auVar76 = vcmpps_avx(auVar93,auVar100,1);
            auVar76 = vandps_avx(auVar76,auVar142);
            auVar76 = vsubps_avx(auVar100,auVar76);
            auVar11._4_4_ = auVar76._4_4_ * 0.6931472;
            auVar11._0_4_ = auVar76._0_4_ * 0.6931472;
            auVar11._8_4_ = auVar76._8_4_ * 0.6931472;
            auVar11._12_4_ = auVar76._12_4_ * 0.6931472;
            auVar11._16_4_ = auVar76._16_4_ * 0.6931472;
            auVar11._20_4_ = auVar76._20_4_ * 0.6931472;
            auVar11._24_4_ = auVar76._24_4_ * 0.6931472;
            auVar11._28_4_ = auVar100._28_4_;
            auVar90 = vsubps_avx(auVar90,auVar11);
            fVar120 = auVar90._0_4_;
            fVar130 = auVar90._4_4_;
            fVar126 = auVar90._8_4_;
            fVar135 = auVar90._12_4_;
            fVar127 = auVar90._16_4_;
            fVar136 = auVar90._20_4_;
            fVar128 = auVar90._24_4_;
            auVar98._0_4_ = (int)auVar76._0_4_;
            auVar98._4_4_ = (int)auVar76._4_4_;
            auVar98._8_4_ = (int)auVar76._8_4_;
            auVar98._12_4_ = (int)auVar76._12_4_;
            auVar94._16_4_ = (int)auVar76._16_4_;
            auVar94._0_16_ = auVar98;
            auVar94._20_4_ = (int)auVar76._20_4_;
            auVar94._24_4_ = (int)auVar76._24_4_;
            auVar94._28_4_ = (int)auVar76._28_4_;
            auVar98 = vpslld_avx(auVar98,0x17);
            auVar89 = vpslld_avx(auVar94._16_16_,0x17);
            auVar89 = vpaddd_avx(auVar147,auVar89);
            auVar98 = vpaddd_avx(auVar147,auVar98);
            auVar102._0_4_ =
                 (fVar120 + 1.0 +
                 fVar120 * fVar120 *
                 (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) * fVar120 +
                   0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) * auVar98._0_4_ + 1.0;
            auVar102._4_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar98._4_4_ + 1.0;
            auVar102._8_4_ =
                 (fVar126 + 1.0 +
                 fVar126 * fVar126 *
                 (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                   0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5)) * auVar98._8_4_ + 1.0;
            auVar102._12_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar98._12_4_ + 1.0;
            auVar102._16_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar89._0_4_ + 1.0;
            auVar102._20_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar89._4_4_ + 1.0;
            auVar102._24_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar89._8_4_ + 1.0;
            auVar102._28_4_ = auVar90._28_4_ + 1.0 + auVar100._28_4_ + 1.0;
            auVar100 = vrcpps_avx(auVar102);
            pfVar3 = (float *)(lVar46 + lVar32);
            auVar12._4_4_ = pfVar3[1] * -2.0;
            auVar12._0_4_ = *pfVar3 * -2.0;
            auVar12._8_4_ = pfVar3[2] * -2.0;
            auVar12._12_4_ = pfVar3[3] * -2.0;
            auVar12._16_4_ = pfVar3[4] * -2.0;
            auVar12._20_4_ = pfVar3[5] * -2.0;
            auVar12._24_4_ = pfVar3[6] * -2.0;
            auVar12._28_4_ = 0xc0000000;
            auVar76 = vminps_avx(auVar145,auVar12);
            auVar90 = vmaxps_avx(auVar76,auVar92);
            auVar112._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
            auVar112._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
            auVar112._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
            auVar112._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
            auVar112._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
            auVar112._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
            auVar112._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
            auVar112._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar111 = vroundps_avx(auVar112,1);
            auVar76 = vcmpps_avx(auVar112,auVar111,1);
            auVar76 = vandps_avx(auVar76,auVar142);
            auVar76 = vsubps_avx(auVar111,auVar76);
            auVar13._4_4_ = auVar76._4_4_ * 0.6931472;
            auVar13._0_4_ = auVar76._0_4_ * 0.6931472;
            auVar13._8_4_ = auVar76._8_4_ * 0.6931472;
            auVar13._12_4_ = auVar76._12_4_ * 0.6931472;
            auVar13._16_4_ = auVar76._16_4_ * 0.6931472;
            auVar13._20_4_ = auVar76._20_4_ * 0.6931472;
            auVar13._24_4_ = auVar76._24_4_ * 0.6931472;
            auVar13._28_4_ = auVar111._28_4_;
            auVar90 = vsubps_avx(auVar90,auVar13);
            fVar120 = auVar90._0_4_;
            fVar130 = auVar90._4_4_;
            fVar126 = auVar90._8_4_;
            fVar135 = auVar90._12_4_;
            fVar127 = auVar90._16_4_;
            fVar136 = auVar90._20_4_;
            fVar128 = auVar90._24_4_;
            auVar109._0_4_ = (int)auVar76._0_4_;
            auVar109._4_4_ = (int)auVar76._4_4_;
            auVar109._8_4_ = (int)auVar76._8_4_;
            auVar109._12_4_ = (int)auVar76._12_4_;
            auVar113._16_4_ = (int)auVar76._16_4_;
            auVar113._0_16_ = auVar109;
            auVar113._20_4_ = (int)auVar76._20_4_;
            auVar113._24_4_ = (int)auVar76._24_4_;
            auVar113._28_4_ = (int)auVar76._28_4_;
            auVar98 = vpslld_avx(auVar109,0x17);
            auVar89 = vpslld_avx(auVar113._16_16_,0x17);
            auVar89 = vpaddd_avx(auVar147,auVar89);
            auVar98 = vpaddd_avx(auVar147,auVar98);
            auVar80._0_4_ =
                 (fVar120 + 1.0 +
                 fVar120 * fVar120 *
                 (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) * fVar120 +
                   0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) * auVar98._0_4_ + 1.0;
            auVar80._4_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar98._4_4_ + 1.0;
            auVar80._8_4_ =
                 (fVar126 + 1.0 +
                 fVar126 * fVar126 *
                 (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                   0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5)) * auVar98._8_4_ + 1.0;
            auVar80._12_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar98._12_4_ + 1.0;
            auVar80._16_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar89._0_4_ + 1.0;
            auVar80._20_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar89._4_4_ + 1.0;
            auVar80._24_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar89._8_4_ + 1.0;
            auVar80._28_4_ = auVar90._28_4_ + 1.0 + auVar111._28_4_ + 1.0;
            auVar76 = vrcpps_avx(auVar80);
            fVar120 = auVar76._0_4_;
            fVar130 = auVar76._4_4_;
            fVar126 = auVar76._8_4_;
            fVar135 = auVar76._12_4_;
            fVar127 = auVar76._16_4_;
            fVar136 = auVar76._20_4_;
            fVar128 = auVar76._24_4_;
            auVar14._4_4_ = auVar80._4_4_ * (fVar130 + fVar130);
            auVar14._0_4_ = auVar80._0_4_ * (fVar120 + fVar120);
            auVar14._8_4_ = auVar80._8_4_ * (fVar126 + fVar126);
            auVar14._12_4_ = auVar80._12_4_ * (fVar135 + fVar135);
            auVar14._16_4_ = auVar80._16_4_ * (fVar127 + fVar127);
            auVar14._20_4_ = auVar80._20_4_ * (fVar136 + fVar136);
            auVar14._24_4_ = auVar80._24_4_ * (fVar128 + fVar128);
            auVar14._28_4_ = auVar80._28_4_;
            auVar132._8_4_ = 0x40000000;
            auVar132._0_8_ = 0x4000000040000000;
            auVar132._12_4_ = 0x40000000;
            auVar132._16_4_ = 0x40000000;
            auVar132._20_4_ = 0x40000000;
            auVar132._24_4_ = 0x40000000;
            auVar132._28_4_ = 0x40000000;
            auVar90 = vsubps_avx(auVar132,auVar14);
            fVar129 = auVar90._28_4_;
            auVar114._0_4_ = fVar120 + fVar120 + -1.0 + fVar120 * auVar90._0_4_;
            auVar114._4_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar90._4_4_;
            auVar114._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar90._8_4_;
            auVar114._12_4_ = fVar135 + fVar135 + -1.0 + fVar135 * auVar90._12_4_;
            auVar114._16_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar90._16_4_;
            auVar114._20_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar90._20_4_;
            auVar114._24_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar90._24_4_;
            auVar114._28_4_ = auVar76._28_4_ + auVar76._28_4_ + -1.0 + fVar129;
            fVar75 = auVar114._0_4_ * auVar100._0_4_;
            fVar83 = auVar114._4_4_ * auVar100._4_4_;
            fVar84 = auVar114._8_4_ * auVar100._8_4_;
            fVar85 = auVar114._12_4_ * auVar100._12_4_;
            fVar86 = auVar114._16_4_ * auVar100._16_4_;
            fVar87 = auVar114._20_4_ * auVar100._20_4_;
            fVar88 = auVar114._24_4_ * auVar100._24_4_;
            auVar15._4_4_ = auVar102._4_4_ * fVar83;
            auVar15._0_4_ = auVar102._0_4_ * fVar75;
            auVar15._8_4_ = auVar102._8_4_ * fVar84;
            auVar15._12_4_ = auVar102._12_4_ * fVar85;
            auVar15._16_4_ = auVar102._16_4_ * fVar86;
            auVar15._20_4_ = auVar102._20_4_ * fVar87;
            auVar15._24_4_ = auVar102._24_4_ * fVar88;
            auVar15._28_4_ = auVar102._28_4_;
            auVar131 = vsubps_avx(auVar114,auVar15);
            auVar76 = *(undefined1 (*) [32])((long)ppp_Var65 + lVar32);
            auVar103._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar103._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar103._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar103._16_4_ = auVar76._16_4_ ^ 0x80000000;
            auVar103._20_4_ = auVar76._20_4_ ^ 0x80000000;
            auVar103._24_4_ = auVar76._24_4_ ^ 0x80000000;
            auVar103._28_4_ = auVar76._28_4_ ^ 0x80000000;
            auVar76 = vminps_avx(auVar145,auVar103);
            auVar141._8_4_ = 0xc2b0c0a5;
            auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar141._12_4_ = 0xc2b0c0a5;
            auVar141._16_4_ = 0xc2b0c0a5;
            auVar141._20_4_ = 0xc2b0c0a5;
            auVar141._24_4_ = 0xc2b0c0a5;
            auVar141._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar76,auVar141);
            auVar115._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
            auVar115._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
            auVar115._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
            auVar115._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
            auVar115._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
            auVar115._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
            auVar115._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
            auVar115._28_4_ = auVar114._28_4_ + 0.5;
            auVar111 = vroundps_avx(auVar115,1);
            auVar76 = vcmpps_avx(auVar115,auVar111,1);
            auVar76 = vandps_avx(auVar76,auVar142);
            auVar76 = vsubps_avx(auVar111,auVar76);
            auVar16._4_4_ = auVar76._4_4_ * 0.6931472;
            auVar16._0_4_ = auVar76._0_4_ * 0.6931472;
            auVar16._8_4_ = auVar76._8_4_ * 0.6931472;
            auVar16._12_4_ = auVar76._12_4_ * 0.6931472;
            auVar16._16_4_ = auVar76._16_4_ * 0.6931472;
            auVar16._20_4_ = auVar76._20_4_ * 0.6931472;
            auVar16._24_4_ = auVar76._24_4_ * 0.6931472;
            auVar16._28_4_ = auVar111._28_4_;
            auVar90 = vsubps_avx(auVar90,auVar16);
            fVar120 = auVar90._0_4_;
            fVar130 = auVar90._4_4_;
            fVar126 = auVar90._8_4_;
            fVar135 = auVar90._12_4_;
            fVar127 = auVar90._16_4_;
            fVar136 = auVar90._20_4_;
            fVar128 = auVar90._24_4_;
            auVar110._0_4_ = (int)auVar76._0_4_;
            auVar110._4_4_ = (int)auVar76._4_4_;
            auVar110._8_4_ = (int)auVar76._8_4_;
            auVar110._12_4_ = (int)auVar76._12_4_;
            auVar116._16_4_ = (int)auVar76._16_4_;
            auVar116._0_16_ = auVar110;
            auVar116._20_4_ = (int)auVar76._20_4_;
            auVar116._24_4_ = (int)auVar76._24_4_;
            auVar116._28_4_ = (int)auVar76._28_4_;
            auVar98 = vpslld_avx(auVar110,0x17);
            auVar89 = vpslld_avx(auVar116._16_16_,0x17);
            auVar89 = vpaddd_avx(auVar147,auVar89);
            auVar98 = vpaddd_avx(auVar147,auVar98);
            auVar104._0_4_ =
                 (fVar120 + 1.0 +
                 fVar120 * fVar120 *
                 (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) * fVar120 +
                   0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) * auVar98._0_4_ + 1.0;
            auVar104._4_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar98._4_4_ + 1.0;
            auVar104._8_4_ =
                 (fVar126 + 1.0 +
                 fVar126 * fVar126 *
                 (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                   0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5)) * auVar98._8_4_ + 1.0;
            auVar104._12_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar98._12_4_ + 1.0;
            auVar104._16_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar89._0_4_ + 1.0;
            auVar104._20_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar89._4_4_ + 1.0;
            auVar104._24_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar89._8_4_ + 1.0;
            auVar104._28_4_ = auVar90._28_4_ + 1.0 + auVar111._28_4_ + 1.0;
            auVar111 = vrcpps_avx(auVar104);
            auVar76 = *(undefined1 (*) [32])((long)pvVar45 + lVar32);
            fVar130 = auVar76._0_4_ * auVar111._0_4_;
            fVar135 = auVar76._4_4_ * auVar111._4_4_;
            fVar136 = auVar76._8_4_ * auVar111._8_4_;
            fVar137 = auVar76._12_4_ * auVar111._12_4_;
            fVar138 = auVar76._16_4_ * auVar111._16_4_;
            fVar139 = auVar76._20_4_ * auVar111._20_4_;
            fVar140 = auVar76._24_4_ * auVar111._24_4_;
            auVar17._4_4_ = auVar104._4_4_ * fVar135;
            auVar17._0_4_ = auVar104._0_4_ * fVar130;
            auVar17._8_4_ = auVar104._8_4_ * fVar136;
            auVar17._12_4_ = auVar104._12_4_ * fVar137;
            auVar17._16_4_ = auVar104._16_4_ * fVar138;
            auVar17._20_4_ = auVar104._20_4_ * fVar139;
            auVar17._24_4_ = auVar104._24_4_ * fVar140;
            auVar17._28_4_ = auVar104._28_4_;
            auVar143 = vsubps_avx(auVar76,auVar17);
            auVar90 = *(undefined1 (*) [32])((long)pvVar41 + lVar32);
            auVar117._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar117._8_4_ = auVar90._8_4_ ^ 0x80000000;
            auVar117._12_4_ = auVar90._12_4_ ^ 0x80000000;
            auVar117._16_4_ = auVar90._16_4_ ^ 0x80000000;
            auVar117._20_4_ = auVar90._20_4_ ^ 0x80000000;
            auVar117._24_4_ = auVar90._24_4_ ^ 0x80000000;
            auVar117._28_4_ = auVar90._28_4_ ^ 0x80000000;
            auVar90 = vminps_avx(auVar145,auVar117);
            auVar90 = vmaxps_avx(auVar90,auVar141);
            auVar123._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
            auVar123._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
            auVar123._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
            auVar123._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
            auVar123._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
            auVar123._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
            auVar123._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
            auVar123._28_4_ = auVar76._28_4_ + 0.5;
            auVar122 = vroundps_avx(auVar123,1);
            auVar76 = vcmpps_avx(auVar123,auVar122,1);
            auVar76 = vandps_avx(auVar76,auVar142);
            auVar76 = vsubps_avx(auVar122,auVar76);
            auVar18._4_4_ = auVar76._4_4_ * 0.6931472;
            auVar18._0_4_ = auVar76._0_4_ * 0.6931472;
            auVar18._8_4_ = auVar76._8_4_ * 0.6931472;
            auVar18._12_4_ = auVar76._12_4_ * 0.6931472;
            auVar18._16_4_ = auVar76._16_4_ * 0.6931472;
            auVar18._20_4_ = auVar76._20_4_ * 0.6931472;
            auVar18._24_4_ = auVar76._24_4_ * 0.6931472;
            auVar18._28_4_ = auVar122._28_4_;
            auVar77 = vsubps_avx(auVar90,auVar18);
            fVar120 = auVar77._0_4_;
            fVar126 = auVar77._4_4_;
            fVar127 = auVar77._8_4_;
            fVar128 = auVar77._12_4_;
            fVar146 = auVar77._16_4_;
            fVar9 = auVar77._20_4_;
            fVar10 = auVar77._24_4_;
            auVar121._0_4_ = (int)auVar76._0_4_;
            auVar121._4_4_ = (int)auVar76._4_4_;
            auVar121._8_4_ = (int)auVar76._8_4_;
            auVar121._12_4_ = (int)auVar76._12_4_;
            auVar124._16_4_ = (int)auVar76._16_4_;
            auVar124._0_16_ = auVar121;
            auVar124._20_4_ = (int)auVar76._20_4_;
            auVar124._24_4_ = (int)auVar76._24_4_;
            auVar124._28_4_ = (int)auVar76._28_4_;
            auVar98 = vpslld_avx(auVar121,0x17);
            auVar89 = vpslld_avx(auVar124._16_16_,0x17);
            auVar89 = vpaddd_avx(auVar147,auVar89);
            auVar98 = vpaddd_avx(auVar147,auVar98);
            auVar81._0_4_ =
                 fVar130 + auVar111._0_4_ * auVar143._0_4_ + fVar75 +
                 auVar100._0_4_ * auVar131._0_4_;
            auVar81._4_4_ =
                 fVar135 + auVar111._4_4_ * auVar143._4_4_ + fVar83 +
                 auVar100._4_4_ * auVar131._4_4_;
            auVar81._8_4_ =
                 fVar136 + auVar111._8_4_ * auVar143._8_4_ + fVar84 +
                 auVar100._8_4_ * auVar131._8_4_;
            auVar81._12_4_ =
                 fVar137 + auVar111._12_4_ * auVar143._12_4_ + fVar85 +
                 auVar100._12_4_ * auVar131._12_4_;
            auVar81._16_4_ =
                 fVar138 + auVar111._16_4_ * auVar143._16_4_ + fVar86 +
                 auVar100._16_4_ * auVar131._16_4_;
            auVar81._20_4_ =
                 fVar139 + auVar111._20_4_ * auVar143._20_4_ + fVar87 +
                 auVar100._20_4_ * auVar131._20_4_;
            auVar81._24_4_ =
                 fVar140 + auVar111._24_4_ * auVar143._24_4_ + fVar88 +
                 auVar100._24_4_ * auVar131._24_4_;
            auVar81._28_4_ = auVar143._28_4_ + 2.718064 + fVar129 + fVar129;
            auVar19._4_4_ = auVar81._4_4_ * -2.0;
            auVar19._0_4_ = auVar81._0_4_ * -2.0;
            auVar19._8_4_ = auVar81._8_4_ * -2.0;
            auVar19._12_4_ = auVar81._12_4_ * -2.0;
            auVar19._16_4_ = auVar81._16_4_ * -2.0;
            auVar19._20_4_ = auVar81._20_4_ * -2.0;
            auVar19._24_4_ = auVar81._24_4_ * -2.0;
            auVar19._28_4_ = 0xc0000000;
            auVar76 = vminps_avx(auVar145,auVar19);
            auVar105._8_4_ = 0xc2b0c0a5;
            auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar105._12_4_ = 0xc2b0c0a5;
            auVar105._16_4_ = 0xc2b0c0a5;
            auVar105._20_4_ = 0xc2b0c0a5;
            auVar105._24_4_ = 0xc2b0c0a5;
            auVar105._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar76,auVar105);
            auVar106._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
            auVar106._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
            auVar106._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
            auVar106._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
            auVar106._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
            auVar106._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
            auVar106._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
            auVar106._28_4_ = 0xc2afc0a5;
            auVar100 = vroundps_avx(auVar106,1);
            auVar76 = vcmpps_avx(auVar106,auVar100,1);
            auVar76 = vandps_avx(auVar76,auVar142);
            auVar76 = vsubps_avx(auVar100,auVar76);
            auVar20._4_4_ = auVar76._4_4_ * 0.6931472;
            auVar20._0_4_ = auVar76._0_4_ * 0.6931472;
            auVar20._8_4_ = auVar76._8_4_ * 0.6931472;
            auVar20._12_4_ = auVar76._12_4_ * 0.6931472;
            auVar20._16_4_ = auVar76._16_4_ * 0.6931472;
            auVar20._20_4_ = auVar76._20_4_ * 0.6931472;
            auVar20._24_4_ = auVar76._24_4_ * 0.6931472;
            auVar20._28_4_ = auVar100._28_4_;
            auVar90 = vsubps_avx(auVar90,auVar20);
            fVar130 = auVar90._0_4_;
            fVar135 = auVar90._4_4_;
            fVar136 = auVar90._8_4_;
            fVar129 = auVar90._12_4_;
            fVar75 = auVar90._16_4_;
            fVar83 = auVar90._20_4_;
            fVar84 = auVar90._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar118._0_4_ =
                 (fVar120 + 1.0 +
                 fVar120 * fVar120 *
                 (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) * fVar120 +
                   0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) * auVar98._0_4_ + 1.0;
            auVar118._4_4_ =
                 (fVar126 + 1.0 +
                 fVar126 * fVar126 *
                 (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                   0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5)) * auVar98._4_4_ + 1.0;
            auVar118._8_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar98._8_4_ + 1.0;
            auVar118._12_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar98._12_4_ + 1.0;
            auVar118._16_4_ =
                 (fVar146 + 1.0 +
                 fVar146 * fVar146 *
                 (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                   0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5)) * auVar89._0_4_ + 1.0;
            auVar118._20_4_ =
                 (fVar9 + 1.0 +
                 fVar9 * fVar9 *
                 (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5)) * auVar89._4_4_ + 1.0;
            auVar118._24_4_ =
                 (fVar10 + 1.0 +
                 fVar10 * fVar10 *
                 (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
                   0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar89._8_4_ + 1.0;
            auVar118._28_4_ = auVar77._28_4_ + 1.0 + auVar122._28_4_ + 1.0;
            auVar99._0_4_ = (int)auVar76._0_4_;
            auVar99._4_4_ = (int)auVar76._4_4_;
            auVar99._8_4_ = (int)auVar76._8_4_;
            auVar99._12_4_ = (int)auVar76._12_4_;
            auVar107._16_4_ = (int)auVar76._16_4_;
            auVar107._0_16_ = auVar99;
            auVar107._20_4_ = (int)auVar76._20_4_;
            auVar107._24_4_ = (int)auVar76._24_4_;
            auVar107._28_4_ = (int)auVar76._28_4_;
            auVar98 = vpslld_avx(auVar99,0x17);
            auVar89 = vpslld_avx(auVar107._16_16_,0x17);
            auVar89 = vpaddd_avx(auVar147,auVar89);
            auVar98 = vpaddd_avx(auVar147,auVar98);
            auVar95._0_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar98._0_4_ + 1.0;
            auVar95._4_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar98._4_4_ + 1.0;
            auVar95._8_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar98._8_4_ + 1.0;
            auVar95._12_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar98._12_4_ + 1.0;
            auVar95._16_4_ =
                 (fVar75 + 1.0 +
                 fVar75 * fVar75 *
                 (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                   0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5)) * auVar89._0_4_ + 1.0;
            auVar95._20_4_ =
                 (fVar83 + 1.0 +
                 fVar83 * fVar83 *
                 (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                   0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5)) * auVar89._4_4_ + 1.0;
            auVar95._24_4_ =
                 (fVar84 + 1.0 +
                 fVar84 * fVar84 *
                 (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                   0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar89._8_4_ + 1.0;
            auVar95._28_4_ = auVar90._28_4_ + 1.0 + auVar100._28_4_ + 1.0;
            auVar76 = vrcpps_avx(auVar95);
            fVar120 = auVar76._0_4_;
            fVar130 = auVar76._4_4_;
            fVar126 = auVar76._8_4_;
            fVar135 = auVar76._12_4_;
            fVar127 = auVar76._16_4_;
            fVar136 = auVar76._20_4_;
            fVar128 = auVar76._24_4_;
            auVar21._4_4_ = auVar95._4_4_ * (fVar130 + fVar130);
            auVar21._0_4_ = auVar95._0_4_ * (fVar120 + fVar120);
            auVar21._8_4_ = auVar95._8_4_ * (fVar126 + fVar126);
            auVar21._12_4_ = auVar95._12_4_ * (fVar135 + fVar135);
            auVar21._16_4_ = auVar95._16_4_ * (fVar127 + fVar127);
            auVar21._20_4_ = auVar95._20_4_ * (fVar136 + fVar136);
            auVar21._24_4_ = auVar95._24_4_ * (fVar128 + fVar128);
            auVar21._28_4_ = auVar95._28_4_;
            auVar133._8_4_ = 0x40000000;
            auVar133._0_8_ = 0x4000000040000000;
            auVar133._12_4_ = 0x40000000;
            auVar133._16_4_ = 0x40000000;
            auVar133._20_4_ = 0x40000000;
            auVar133._24_4_ = 0x40000000;
            auVar133._28_4_ = 0x40000000;
            auVar100 = vsubps_avx(auVar133,auVar21);
            auVar90 = vrcpps_avx(auVar118);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar129 = auVar76._28_4_ + auVar76._28_4_ + -1.0;
            auVar96._0_4_ = fVar120 + fVar120 + -1.0 + fVar120 * auVar100._0_4_;
            auVar96._4_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar100._4_4_;
            auVar96._8_4_ = fVar126 + fVar126 + -1.0 + fVar126 * auVar100._8_4_;
            auVar96._12_4_ = fVar135 + fVar135 + -1.0 + fVar135 * auVar100._12_4_;
            auVar96._16_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar100._16_4_;
            auVar96._20_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar100._20_4_;
            auVar96._24_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar100._24_4_;
            auVar96._28_4_ = fVar129 + auVar100._28_4_;
            fVar120 = auVar96._0_4_ * auVar90._0_4_;
            fVar130 = auVar96._4_4_ * auVar90._4_4_;
            fVar126 = auVar96._8_4_ * auVar90._8_4_;
            fVar135 = auVar96._12_4_ * auVar90._12_4_;
            fVar127 = auVar96._16_4_ * auVar90._16_4_;
            fVar136 = auVar96._20_4_ * auVar90._20_4_;
            fVar128 = auVar96._24_4_ * auVar90._24_4_;
            auVar22._4_4_ = auVar118._4_4_ * fVar130;
            auVar22._0_4_ = auVar118._0_4_ * fVar120;
            auVar22._8_4_ = auVar118._8_4_ * fVar126;
            auVar22._12_4_ = auVar118._12_4_ * fVar135;
            auVar22._16_4_ = auVar118._16_4_ * fVar127;
            auVar22._20_4_ = auVar118._20_4_ * fVar136;
            auVar22._24_4_ = auVar118._24_4_ * fVar128;
            auVar22._28_4_ = auVar118._28_4_;
            in_ZMM3 = ZEXT3264(auVar22);
            auVar76 = vsubps_avx(auVar96,auVar22);
            fVar120 = fVar120 + auVar90._0_4_ * auVar76._0_4_;
            fVar130 = fVar130 + auVar90._4_4_ * auVar76._4_4_;
            fVar126 = fVar126 + auVar90._8_4_ * auVar76._8_4_;
            fVar135 = fVar135 + auVar90._12_4_ * auVar76._12_4_;
            fVar127 = fVar127 + auVar90._16_4_ * auVar76._16_4_;
            fVar136 = fVar136 + auVar90._20_4_ * auVar76._20_4_;
            fVar128 = fVar128 + auVar90._24_4_ * auVar76._24_4_;
            fVar129 = fVar129 + auVar76._28_4_;
            *(undefined1 (*) [32])((long)pvVar45 + lVar32) = auVar81;
            pfVar3 = (float *)((long)local_2f8 + lVar32);
            *pfVar3 = fVar120;
            pfVar3[1] = fVar130;
            pfVar3[2] = fVar126;
            pfVar3[3] = fVar135;
            pfVar3[4] = fVar127;
            pfVar3[5] = fVar136;
            pfVar3[6] = fVar128;
            pfVar3[7] = fVar129;
            pfVar3 = (float *)((long)pvVar74 + lVar32);
            *pfVar3 = fVar120;
            pfVar3[1] = fVar130;
            pfVar3[2] = fVar126;
            pfVar3[3] = fVar135;
            pfVar3[4] = fVar127;
            pfVar3[5] = fVar136;
            pfVar3[6] = fVar128;
            pfVar3[7] = fVar129;
            uVar35 = uVar35 - 1;
            lVar27 = lVar32 + 0x20;
          } while (1 < uVar35);
          lVar46 = lVar46 + lVar27;
          pvVar41 = (void *)((long)pvVar41 + lVar27);
          ppp_Var65 = (_func_int ***)((long)(ppp_Var65 + 4) + lVar32);
          pAVar60 = (Allocator *)
                    ((long)&((Allocator *)((long)local_78.data + 0x20))->_vptr_Allocator + lVar32);
          local_2f8 = (void *)((long)local_2f8 + lVar27);
          pvVar45 = (void *)((long)pvVar45 + lVar27);
          pvVar74 = (void *)((long)pvVar74 + lVar27);
        }
        if (uVar38 != 0) {
          lVar27 = 0;
          iVar61 = iVar39;
          do {
            fVar120 = *(float *)(lVar46 + lVar27);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar130 = expf(-*(float *)((long)&pAVar60->_vptr_Allocator + lVar27));
            fVar126 = expf(-*(float *)((long)ppp_Var65 + lVar27));
            fVar135 = expf(-*(float *)((long)pvVar41 + lVar27));
            fVar120 = tanhf(fVar120);
            fVar120 = *(float *)((long)pvVar45 + lVar27) / (fVar126 + 1.0) +
                      fVar120 / (fVar130 + 1.0);
            fVar130 = tanhf(fVar120);
            fVar130 = fVar130 / (fVar135 + 1.0);
            *(float *)((long)pvVar45 + lVar27) = fVar120;
            *(float *)((long)local_2f8 + lVar27) = fVar130;
            *(float *)((long)pvVar74 + lVar27) = fVar130;
            iVar61 = iVar61 + -1;
            lVar27 = lVar27 + 4;
          } while (1 < iVar61);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar7);
    }
    iVar39 = 0;
  }
  piVar23 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(num_output, 4, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        int nn_num_output = num_output >> 1;
        int remain_num_output_start = nn_num_output << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_num_output; qq++)
        {
            int q = qq * 2;

            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I_0 = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F_0 = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O_0 = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G_0 = weight_xc.row(num_output * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(num_output * 0 + (q + 1));
            const float* weight_xc_F_1 = weight_xc.row(num_output * 1 + (q + 1));
            const float* weight_xc_O_1 = weight_xc.row(num_output * 2 + (q + 1));
            const float* weight_xc_G_1 = weight_xc.row(num_output * 3 + (q + 1));

            const float* weight_hc_I_0 = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F_0 = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O_0 = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G_0 = weight_hc.row(num_output * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(num_output * 0 + (q + 1));
            const float* weight_hc_F_1 = weight_hc.row(num_output * 1 + (q + 1));
            const float* weight_hc_O_1 = weight_hc.row(num_output * 2 + (q + 1));
            const float* weight_hc_G_1 = weight_hc.row(num_output * 3 + (q + 1));

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI_0 = _mm256_setzero_ps();
            __m256 _sumF_0 = _mm256_setzero_ps();
            __m256 _sumO_0 = _mm256_setzero_ps();
            __m256 _sumG_0 = _mm256_setzero_ps();
            __m256 _sumI_1 = _mm256_setzero_ps();
            __m256 _sumF_1 = _mm256_setzero_ps();
            __m256 _sumO_1 = _mm256_setzero_ps();
            __m256 _sumG_1 = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_0), xi, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_0), xi, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_0), xi, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_0), xi, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_1), xi, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_1), xi, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_1), xi, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_1), xi, _sumG_1);
                x += 8;
                weight_xc_I_0 += 8;
                weight_xc_F_0 += 8;
                weight_xc_O_0 += 8;
                weight_xc_G_0 += 8;
                weight_xc_I_1 += 8;
                weight_xc_F_1 += 8;
                weight_xc_O_1 += 8;
                weight_xc_G_1 += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_0), h_cont, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_0), h_cont, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_0), h_cont, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_0), h_cont, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_1), h_cont, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_1), h_cont, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_1), h_cont, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_1), h_cont, _sumG_1);
                hidden_ptr_r += 8;
                weight_hc_I_0 += 8;
                weight_hc_F_0 += 8;
                weight_hc_O_0 += 8;
                weight_hc_G_0 += 8;
                weight_hc_I_1 += 8;
                weight_hc_F_1 += 8;
                weight_hc_O_1 += 8;
                weight_hc_G_1 += 8;
            }
            float sums[8];
            _mm256_storeu_ps(sums, HorizontalSums(_sumI_0, _sumF_0, _sumO_0, _sumG_0, _sumI_1, _sumF_1, _sumO_1, _sumG_1));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];
            sums[4] += bias_c_I[q + 1];
            sums[5] += bias_c_F[q + 1];
            sums[6] += bias_c_O[q + 1];
            sums[7] += bias_c_G[q + 1];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I_0 * xi;
                sums[1] += *weight_xc_F_0 * xi;
                sums[2] += *weight_xc_O_0 * xi;
                sums[3] += *weight_xc_G_0 * xi;
                sums[4] += *weight_xc_I_1 * xi;
                sums[5] += *weight_xc_F_1 * xi;
                sums[6] += *weight_xc_O_1 * xi;
                sums[7] += *weight_xc_G_1 * xi;
                x++;
                weight_xc_I_0++;
                weight_xc_F_0++;
                weight_xc_O_0++;
                weight_xc_G_0++;
                weight_xc_I_1++;
                weight_xc_F_1++;
                weight_xc_O_1++;
                weight_xc_G_1++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I_0 * h_cont;
                sums[1] += *weight_hc_F_0 * h_cont;
                sums[2] += *weight_hc_O_0 * h_cont;
                sums[3] += *weight_hc_G_0 * h_cont;
                sums[4] += *weight_hc_I_1 * h_cont;
                sums[5] += *weight_hc_F_1 * h_cont;
                sums[6] += *weight_hc_O_1 * h_cont;
                sums[7] += *weight_hc_G_1 * h_cont;
                hidden_ptr_r++;
                weight_hc_I_0++;
                weight_hc_F_0++;
                weight_hc_O_0++;
                weight_hc_G_0++;
                weight_hc_I_1++;
                weight_hc_F_1++;
                weight_hc_O_1++;
                weight_hc_G_1++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
            gates_data_I[q + 1] = sums[4];
            gates_data_F[q + 1] = sums[5];
            gates_data_O[q + 1] = sums[6];
            gates_data_G[q + 1] = sums[7];
        }
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_num_output_start; q < num_output; q++)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI = _mm256_setzero_ps();
            __m256 _sumF = _mm256_setzero_ps();
            __m256 _sumO = _mm256_setzero_ps();
            __m256 _sumG = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I), xi, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F), xi, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O), xi, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G), xi, _sumG);
                x += 8;
                weight_xc_I += 8;
                weight_xc_F += 8;
                weight_xc_O += 8;
                weight_xc_G += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I), h_cont, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F), h_cont, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O), h_cont, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G), h_cont, _sumG);
                hidden_ptr_r += 8;
                weight_hc_I += 8;
                weight_hc_F += 8;
                weight_hc_O += 8;
                weight_hc_G += 8;
            }
            float sums[4];
            _mm_storeu_ps(sums, HorizontalSums(_sumI, _sumF, _sumO, _sumG));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I * xi;
                sums[1] += *weight_xc_F * xi;
                sums[2] += *weight_xc_O * xi;
                sums[3] += *weight_xc_G * xi;
                x++;
                weight_xc_I++;
                weight_xc_F++;
                weight_xc_O++;
                weight_xc_G++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I * h_cont;
                sums[1] += *weight_hc_F * h_cont;
                sums[2] += *weight_hc_O * h_cont;
                sums[3] += *weight_hc_G * h_cont;
                hidden_ptr_r++;
                weight_hc_I++;
                weight_hc_F++;
                weight_hc_O++;
                weight_hc_G++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        const float* gates_data_I = gates.row(0);
        const float* gates_data_F = gates.row(1);
        const float* gates_data_O = gates.row(2);
        const float* gates_data_G = gates.row(3);
        int nn_activation = num_output >> 3;
        int remain_activations = num_output & 7;
        for (; nn_activation > 0; nn_activation--)
        {
            __m256 I = sigmoid_avx(_mm256_loadu_ps(gates_data_I));
            __m256 F = sigmoid_avx(_mm256_loadu_ps(gates_data_F));
            __m256 O = sigmoid_avx(_mm256_loadu_ps(gates_data_O));
            __m256 G = tanh_avx(_mm256_loadu_ps(gates_data_G));
            __m256 cell2 = _mm256_add_ps(_mm256_mul_ps(F, _mm256_loadu_ps(cell_ptr)), _mm256_mul_ps(I, G));
            __m256 H = _mm256_mul_ps(O, tanh_avx(cell2));
            _mm256_storeu_ps(cell_ptr, cell2);
            _mm256_storeu_ps(hidden_ptr, H);
            _mm256_storeu_ps(output_data, H);
            cell_ptr += 8;
            output_data += 8;
            hidden_ptr += 8;
            gates_data_I += 8;
            gates_data_F += 8;
            gates_data_O += 8;
            gates_data_G += 8;
        }
        for (; remain_activations > 0; remain_activations--)
        {
            float I = *gates_data_I;
            float F = *gates_data_F;
            float O = *gates_data_O;
            float G = *gates_data_G;

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);
            float cell2 = F * *cell_ptr + I * G;
            float H = O * tanh(cell2);
            *cell_ptr = cell2;
            *hidden_ptr = H;
            *output_data = H;
            cell_ptr++;
            output_data++;
            hidden_ptr++;
            gates_data_I++;
            gates_data_F++;
            gates_data_O++;
            gates_data_G++;
        }

        // no cell output here
    }

    return 0;
}